

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testanimators.cpp
# Opt level: O1

Am_Wrapper * which_way_proc(Am_Object *self)

{
  int iVar1;
  Am_Value *this;
  Am_Wrapper *pAVar2;
  undefined1 *this_00;
  Am_Object local_20;
  Am_Object local_18;
  Am_Object local_10;
  
  Am_Object::Get_Object((ushort)&local_10,(ulong)self);
  Am_Object::Get_Object((ushort)&local_20,(ulong)&local_10);
  Am_Object::Get_Object((ushort)&local_18,(ulong)&local_20);
  this = (Am_Value *)Am_Object::Get((ushort)&local_18,0x11d);
  iVar1 = Am_Value::operator_cast_to_int(this);
  Am_Object::~Am_Object(&local_18);
  Am_Object::~Am_Object(&local_20);
  Am_Object::~Am_Object(&local_10);
  this_00 = eye_walking_left;
  if (0 < iVar1) {
    this_00 = eye_walking_right;
  }
  pAVar2 = Am_Value_List::operator_cast_to_Am_Wrapper_((Am_Value_List *)this_00);
  return pAVar2;
}

Assistant:

Am_Define_Value_List_Formula(which_way)
{
  int x_offset = self.Get_Object(Am_OPERATES_ON)
                     .Get_Object(WALKER)
                     .Get_Object(Am_COMMAND)
                     .Get(Am_X_OFFSET);
  if (x_offset > 0)
    return eye_walking_right;
  else
    return eye_walking_left;
}